

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

void __thiscall CLI::Range::Range<int>(Range *this,int min_val,int max_val,string *validator_name)

{
  ulong uVar1;
  char *pcVar2;
  ostream *poVar3;
  anon_class_8_2_9d22b477 local_200;
  string local_1f8;
  stringstream local_1d8 [8];
  stringstream out;
  ostream local_1c8 [392];
  string local_40;
  string *local_20;
  string *validator_name_local;
  int max_val_local;
  int min_val_local;
  Range *this_local;
  
  local_20 = validator_name;
  validator_name_local._0_4_ = max_val;
  validator_name_local._4_4_ = min_val;
  _max_val_local = this;
  ::std::__cxx11::string::string((string *)&local_40,(string *)validator_name);
  Validator::Validator(&this->super_Validator,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    ::std::__cxx11::stringstream::stringstream(local_1d8);
    pcVar2 = CLI::detail::type_name<int,_(CLI::detail::enabler)0>();
    poVar3 = ::std::operator<<(local_1c8,pcVar2);
    poVar3 = ::std::operator<<(poVar3," in [");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,validator_name_local._4_4_);
    poVar3 = ::std::operator<<(poVar3," - ");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,(int)validator_name_local);
    ::std::operator<<(poVar3,"]");
    ::std::__cxx11::stringstream::str();
    Validator::description(&this->super_Validator,&local_1f8);
    ::std::__cxx11::string::~string((string *)&local_1f8);
    ::std::__cxx11::stringstream::~stringstream(local_1d8);
  }
  local_200.min_val = validator_name_local._4_4_;
  local_200.max_val = (int)validator_name_local;
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&(this->super_Validator).func_
             ,&local_200);
  return;
}

Assistant:

Range(T min_val, T max_val, const std::string &validator_name = std::string{}) : Validator(validator_name) {
        if(validator_name.empty()) {
            std::stringstream out;
            out << detail::type_name<T>() << " in [" << min_val << " - " << max_val << "]";
            description(out.str());
        }

        func_ = [min_val, max_val](std::string &input) {
            using CLI::detail::lexical_cast;
            T val;
            bool converted = lexical_cast(input, val);
            if((!converted) || (val < min_val || val > max_val)) {
                std::stringstream out;
                out << "Value " << input << " not in range [";
                out << min_val << " - " << max_val << "]";
                return out.str();
            }
            return std::string{};
        };
    }